

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxVisitor<no_implicit_port_name_in_port_connection::PortConnectionVisitor>::
visitDefault<slang::syntax::BinaryBlockEventExpressionSyntax_const&>
          (SyntaxVisitor<no_implicit_port_name_in_port_connection::PortConnectionVisitor> *this,
          BinaryBlockEventExpressionSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  uint uVar2;
  ulong index;
  
  uVar2 = 0;
  while( true ) {
    index = (ulong)uVar2;
    sVar1 = SyntaxNode::getChildCount((SyntaxNode *)node);
    if (sVar1 <= index) break;
    node_00 = SyntaxNode::childNode((SyntaxNode *)node,index);
    if (node_00 == (SyntaxNode *)0x0) {
      SyntaxNode::childToken((SyntaxNode *)node,index);
    }
    else {
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,no_implicit_port_name_in_port_connection::PortConnectionVisitor>
                (node_00,(PortConnectionVisitor *)this);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }